

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLexer.cpp
# Opt level: O0

void __thiscall LStringLexer::LStringLexer(LStringLexer *this,string *str)

{
  string *str_local;
  LStringLexer *this_local;
  
  LLexer::LLexer(&this->super_LLexer);
  (this->super_LLexer)._vptr_LLexer = (_func_int **)&PTR__LStringLexer_00156580;
  std::__cxx11::string::string((string *)&this->str);
  this->cursor = 0;
  std::__cxx11::string::operator=((string *)&this->str,(string *)str);
  (this->super_LLexer).prev_char = '\0';
  this->cursor = 0;
  return;
}

Assistant:

LStringLexer::LStringLexer(std::string str) {
    this->str = std::move(str);
    this->prev_char = 0;
    this->cursor = 0;
}